

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

Unary * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,UnaryOp *args_2,AST **args_3)

{
  size_t *psVar1;
  UnaryOp UVar2;
  AST *pAVar3;
  Unary *this_00;
  _List_node_base *p_Var4;
  
  this_00 = (Unary *)operator_new(0x90);
  UVar2 = *args_2;
  pAVar3 = *args_3;
  AST::AST((AST *)this_00,args,AST_UNARY,args_1);
  (this_00->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0023dcd8;
  this_00->op = UVar2;
  this_00->expr = pAVar3;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }